

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.h
# Opt level: O1

void __thiscall Server<Client>::start(Server<Client> *this)

{
  anon_class_16_2_37edc3c6_for__M_fn *in_RCX;
  sockaddr *in_RDX;
  sockaddr *extraout_RDX;
  Client cl;
  packaged_task<void_()> task;
  undefined1 local_69;
  anon_class_16_2_37edc3c6_for__M_fn local_68;
  undefined1 local_58 [24];
  packaged_task<void_()> local_40;
  
  LOCK();
  (this->is_working)._M_base._M_i = true;
  UNLOCK();
  if (((this->is_working)._M_base._M_i & 1U) != 0) {
    do {
      Acceptor<Client>::accept
                ((Acceptor<Client> *)local_58,(int)this + 8,in_RDX,(socklen_t *)in_RCX);
      local_68.this = this;
      Client::Client(&local_68.client,(Client *)local_58);
      local_58._8_8_ = (impl_type *)0x0;
      in_RCX = &local_68;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::__future_base::_Task_state<Server<Client>::start()::_lambda()_1_,std::allocator<int>,void()>,std::allocator<int>,Server<Client>::start()::_lambda()_1_,std::allocator<int>const&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 0x10),
                 (_Task_state<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_AleksMVP[P]mitm_proxy_include_Server_h:44:13),_std::allocator<int>,_void_()>
                  **)(local_58 + 8),(allocator<int> *)&local_69,in_RCX,(allocator<int> *)&local_69);
      local_40._M_state.
      super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_58._8_8_;
      local_40._M_state.
      super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._16_8_;
      Client::~Client(&local_68.client);
      NotLockFreeQueue<std::packaged_task<void_()>_>::push_and_wait
                (&(this->thread_pool).queue,&local_40);
      std::packaged_task<void_()>::~packaged_task(&local_40);
      Client::~Client((Client *)local_58);
      in_RDX = extraout_RDX;
    } while (((this->is_working)._M_base._M_i & 1U) != 0);
  }
  return;
}

Assistant:

void Server<T>::start() {
    is_working = true;
    while(is_working) {
        T cl(acceptor.accept());
        std::packaged_task<void(void)> task(
            [this, client = std::move(cl)] () mutable {
                handler.handle(std::move(client));
            }
        );
        thread_pool.push(std::move(task));
    }
}